

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O1

void __thiscall adjMaxtrix<char>::BroadFirstSearch(adjMaxtrix<char> *this,_func_void_char *Visit)

{
  pointer pcVar1;
  pointer pcVar2;
  ulong uVar3;
  int *visited;
  long lVar4;
  
  pcVar1 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)pcVar1 - (long)pcVar2;
  visited = (int *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
  lVar4 = (long)pcVar1 - (long)pcVar2;
  if (lVar4 != 0) {
    memset(visited,0,(lVar4 + (ulong)(lVar4 == 0)) * 4);
  }
  if ((this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    do {
      if (visited[uVar3] == 0) {
        BFS(this,(int)uVar3,visited,Visit);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
  }
  operator_delete__(visited);
  return;
}

Assistant:

void adjMaxtrix<dataType>::BroadFirstSearch(void Visit(dataType item)) {
	int i;
	int *visited = new int[vexs.size()];
	for (i = 0; i < vexs.size(); i++)
		visited[i] = 0;
	for (i = 0; i < vexs.size(); i++)
		if (!visited[i])
			BFS(i, visited, Visit);
	delete[] visited;
}